

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::Initialize(ImGuiContext *context)

{
  ImGuiID IVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  ImGuiViewportP *viewport;
  ImGuiSettingsHandler local_58;
  
  if ((context->Initialized == false) && (context->SettingsLoaded != true)) {
    local_58.ReadLineFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_void_ptr_char_ptr *)0x0;
    local_58.ApplyAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_58.WriteAllFn =
         (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_ImGuiTextBuffer_ptr *)0x0;
    local_58.UserData = (void *)0x0;
    local_58.TypeHash = 0;
    local_58._12_4_ = 0;
    local_58.ClearAllFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_58.ReadInitFn = (_func_void_ImGuiContext_ptr_ImGuiSettingsHandler_ptr *)0x0;
    local_58.ReadOpenFn = (_func_void_ptr_ImGuiContext_ptr_ImGuiSettingsHandler_ptr_char_ptr *)0x0;
    local_58.TypeName = "Window";
    IVar1 = ImHashStr("Window",0,0);
    local_58.TypeHash = IVar1;
    local_58.ClearAllFn = WindowSettingsHandler_ClearAll;
    local_58.ReadOpenFn = WindowSettingsHandler_ReadOpen;
    local_58.ReadLineFn = WindowSettingsHandler_ReadLine;
    local_58.ApplyAllFn = WindowSettingsHandler_ApplyAll;
    local_58.WriteAllFn = WindowSettingsHandler_WriteAll;
    ImVector<ImGuiSettingsHandler>::push_back(&context->SettingsHandlers,&local_58);
    TableSettingsInstallHandler(context);
    local_58.TypeName = (char *)MemAlloc(0xb0);
    *(undefined4 *)*(undefined1 (*) [32])((long)local_58.TypeName + 0x20) = 0;
    auVar2 = ZEXT816(0) << 0x40;
    *(undefined1 (*) [32])local_58.TypeName = ZEXT1632(auVar2);
    *(undefined1 (*) [32])((long)local_58.TypeName + 0x40) = ZEXT1632(auVar2);
    auVar3 = ZEXT1632(auVar2);
    *(undefined1 (*) [32])((long)local_58.TypeName + 0x60) = auVar3;
    *(undefined1 (*) [32])((long)local_58.TypeName + 0x80) = auVar3;
    *(undefined1 (*) [32])(*(undefined1 (*) [32])((long)local_58.TypeName + 0x80) + 0x10) = auVar3;
    *(undefined8 *)(*(undefined1 (*) [32])((long)local_58.TypeName + 0x20) + 4) = 0xffffffffffffffff
    ;
    *(undefined1 (*) [16])(*(undefined1 (*) [32])((long)local_58.TypeName + 0x20) + 0x10) =
         ZEXT416(0) << 0x40;
    ImVector<ImGuiViewportP_*>::push_back(&context->Viewports,(ImGuiViewportP **)&local_58);
    context->Initialized = true;
    return;
  }
  __assert_fail("!g.Initialized && !g.SettingsLoaded",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xfe1,"void ImGui::Initialize(ImGuiContext *)");
}

Assistant:

void ImGui::Initialize(ImGuiContext* context)
{
    ImGuiContext& g = *context;
    IM_ASSERT(!g.Initialized && !g.SettingsLoaded);

    // Add .ini handle for ImGuiWindow type
    {
        ImGuiSettingsHandler ini_handler;
        ini_handler.TypeName = "Window";
        ini_handler.TypeHash = ImHashStr("Window");
        ini_handler.ClearAllFn = WindowSettingsHandler_ClearAll;
        ini_handler.ReadOpenFn = WindowSettingsHandler_ReadOpen;
        ini_handler.ReadLineFn = WindowSettingsHandler_ReadLine;
        ini_handler.ApplyAllFn = WindowSettingsHandler_ApplyAll;
        ini_handler.WriteAllFn = WindowSettingsHandler_WriteAll;
        g.SettingsHandlers.push_back(ini_handler);
    }

#ifdef IMGUI_HAS_TABLE
    // Add .ini handle for ImGuiTable type
    TableSettingsInstallHandler(context);
#endif // #ifdef IMGUI_HAS_TABLE

    // Create default viewport
    ImGuiViewportP* viewport = IM_NEW(ImGuiViewportP)();
    g.Viewports.push_back(viewport);

#ifdef IMGUI_HAS_DOCK
#endif // #ifdef IMGUI_HAS_DOCK

    g.Initialized = true;
}